

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O3

void __thiscall Assimp::BatchData::~BatchData(BatchData *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Importer *this_00;
  pointer pcVar2;
  
  Importer::SetIOHandler(this->pImporter,(IOSystem *)0x0);
  this_00 = this->pImporter;
  if (this_00 != (Importer *)0x0) {
    Importer::~Importer(this_00);
  }
  operator_delete(this_00,8);
  pcVar2 = (this->pathBase)._M_dataplus._M_p;
  paVar1 = &(this->pathBase).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::__cxx11::_List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::_M_clear
            (&(this->requests).
              super__List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>);
  return;
}

Assistant:

~BatchData() {
        pImporter->SetIOHandler( nullptr ); /* get pointer back into our possession */
        delete pImporter;
    }